

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cpp
# Opt level: O0

Control * __thiscall Control::toStr_abi_cxx11_(Control *this,Network *nw)

{
  pointer ppNVar1;
  Node *pNVar2;
  ostream *poVar3;
  Network *in_RDX;
  double dVar4;
  Utilities local_1f8 [32];
  Utilities local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream s;
  ostream local_198 [376];
  Network *local_20;
  Network *nw_local;
  Control *this_local;
  
  local_20 = in_RDX;
  nw_local = nw;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar3 = std::operator<<(local_198,"Link ");
  poVar3 = std::operator<<(poVar3,(string *)
                                  ((nw->title).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 8));
  std::operator<<(poVar3," ");
  if (*(int *)&(nw->title).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish == 0) {
    std::operator<<(local_198,"CLOSED");
  }
  else if (*(int *)&(nw->title).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish == 1) {
    std::operator<<(local_198,"OPEN");
  }
  else {
    poVar3 = std::operator<<(local_198," ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(double)(nw->title).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar3," ");
  }
  switch(*(undefined4 *)
          ((long)&(nw->graph).adjListBeg.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 4)) {
  case 0:
    poVar3 = std::operator<<(local_198," IF NODE ");
    poVar3 = std::operator<<(poVar3,(string *)
                                    ((nw->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1));
    std::operator<<(poVar3," ");
    if (*(int *)&(nw->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
                 super__Vector_impl_data._M_start == 0) {
      std::operator<<(local_198,"BELOW");
    }
    else {
      std::operator<<(local_198,"ABOVE");
    }
    poVar3 = std::operator<<(local_198," ");
    ppNVar1 = (nw->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pNVar2 = (nw->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_start[6];
    dVar4 = Network::ucf(local_20,LENGTH);
    std::ostream::operator<<(poVar3,((double)ppNVar1 - (double)pNVar2) * dVar4);
    break;
  case 1:
    poVar3 = std::operator<<(local_198," IF NODE ");
    poVar3 = std::operator<<(poVar3,(string *)
                                    ((nw->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1));
    std::operator<<(poVar3," ");
    if (*(int *)&(nw->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
                 super__Vector_impl_data._M_start == 0) {
      std::operator<<(local_198,"BELOW");
    }
    else {
      std::operator<<(local_198,"ABOVE");
    }
    poVar3 = std::operator<<(local_198," ");
    ppNVar1 = (nw->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pNVar2 = (nw->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_start[6];
    dVar4 = Network::ucf(local_20,PRESSURE);
    std::ostream::operator<<(poVar3,((double)ppNVar1 - (double)pNVar2) * dVar4);
    break;
  case 2:
    poVar3 = std::operator<<(local_198," AT TIME ");
    Utilities::getTime_abi_cxx11_
              (local_1d8,
               *(int *)((long)&(nw->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>.
                               _M_impl.super__Vector_impl_data._M_start + 4));
    std::operator<<(poVar3,(string *)local_1d8);
    std::__cxx11::string::~string((string *)local_1d8);
    break;
  case 3:
    poVar3 = std::operator<<(local_198," AT CLOCKTIME ");
    Utilities::getTime_abi_cxx11_
              (local_1f8,
               *(int *)((long)&(nw->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>.
                               _M_impl.super__Vector_impl_data._M_start + 4));
    std::operator<<(poVar3,(string *)local_1f8);
    std::__cxx11::string::~string((string *)local_1f8);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

string Control::toStr(Network* nw)
{
    // ... write Link name and its control action

    stringstream s;
    s << "Link " << link->name << " ";
    if ( status == CLOSED_STATUS )    s << "CLOSED";
    else if ( status == OPEN_STATUS ) s << "OPEN";
    else s << " " << setting << " ";

    // ... write node condition or time causing the action

    switch (type)
    {
    case TANK_LEVEL:
        s << " IF NODE " << node->name << " ";
        if ( levelType == LOW_LEVEL ) s << "BELOW";
        else s << "ABOVE";
        s << " " << (head - node->elev) * nw->ucf(Units::LENGTH);
        break;

    case PRESSURE_LEVEL:
        s << " IF NODE " << node->name << " ";
        if ( levelType == LOW_LEVEL ) s << "BELOW";
        else s << "ABOVE";
        s << " " << (head - node->elev) * nw->ucf(Units::PRESSURE);
        break;

    case ELAPSED_TIME:
        s << " AT TIME " <<  Utilities::getTime(time);
        break;

    case TIME_OF_DAY:
        s << " AT CLOCKTIME " << Utilities::getTime(time);
        break;
    }
    return s.str();
}